

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O1

void helicsFederateAddDependency(HelicsFederate fed,char *fedName,HelicsError *err)

{
  Federate *this;
  size_t sVar1;
  string_view fedName_00;
  
  this = getFed(fed,err);
  if (this != (Federate *)0x0) {
    if (fedName == (char *)0x0) {
      if (err != (HelicsError *)0x0) {
        err->error_code = -4;
        err->message = "Federate name for dependency cannot be null";
      }
    }
    else {
      sVar1 = strlen(fedName);
      fedName_00._M_str = fedName;
      fedName_00._M_len = sVar1;
      helics::Federate::addDependency(this,fedName_00);
    }
  }
  return;
}

Assistant:

void helicsFederateAddDependency(HelicsFederate fed, const char* fedName, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    if (fedName == nullptr) {
        assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidFedNameString);
        return;
    }
    try {
        fedObj->addDependency(fedName);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}